

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.h
# Opt level: O3

void __thiscall Highs::~Highs(Highs *this)

{
  FILE *__stream;
  pointer pHVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer pHVar4;
  _Manager_type p_Var5;
  pointer pIVar6;
  pointer pHVar7;
  pointer pcVar8;
  
  this->_vptr_Highs = (_func_int **)&PTR__Highs_00440890;
  __stream = (FILE *)(this->options_).super_HighsOptionsStruct.log_options.log_stream;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  (this->presolve_).super_HighsComponent._vptr_HighsComponent = (_func_int **)&PTR_clear_00441208;
  PresolveComponentData::~PresolveComponentData(&(this->presolve_).data_);
  pHVar1 = (this->presolve_log_).rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar1 != (pointer)0x0) {
    operator_delete(pHVar1);
  }
  HEkk::~HEkk(&this->ekk_instance_);
  pdVar2 = (this->standard_form_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->standard_form_matrix_).p_end_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  std::vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>::~vector
            (&this->saved_objective_and_solution_);
  pHVar4 = (this->iis_).info_.super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pHVar4 != (pointer)0x0) {
    operator_delete(pHVar4);
  }
  piVar3 = (this->iis_).row_bound_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->iis_).col_bound_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->iis_).row_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->iis_).col_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  HighsRanging::~HighsRanging(&this->ranging_);
  HighsInfo::~HighsInfo(&this->info_);
  HighsOptions::~HighsOptions(&this->options_);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->callback_).active.super__Bvector_base<std::allocator<bool>_>);
  p_Var5 = (this->callback_).user_callback.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->callback_,(_Any_data *)&this->callback_,__destroy_functor);
  }
  HighsTimer::~HighsTimer(&this->timer_);
  pdVar2 = (this->presolved_model_).hessian_.value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->presolved_model_).hessian_.index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->presolved_model_).hessian_.start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  HighsLp::~HighsLp(&(this->presolved_model_).lp_);
  std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::~vector
            (&this->multi_linear_objective_);
  pdVar2 = (this->model_).hessian_.value_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->model_).hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->model_).hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  HighsLp::~HighsLp(&(this->model_).lp_);
  pdVar2 = (this->icrash_info_).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pIVar6 = (this->icrash_info_).details.
           super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar6 != (pointer)0x0) {
    operator_delete(pIVar6);
  }
  pHVar7 = (this->basis_).row_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar7 != (pointer)0x0) {
    operator_delete(pHVar7);
  }
  pHVar7 = (this->basis_).col_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar7 != (pointer)0x0) {
    operator_delete(pHVar7);
  }
  pcVar8 = (this->basis_).debug_origin_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 != &(this->basis_).debug_origin_name.field_2) {
    operator_delete(pcVar8);
  }
  pdVar2 = (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
    return;
  }
  return;
}

Assistant:

virtual ~Highs() {
    FILE* log_stream = options_.log_options.log_stream;
    if (log_stream != nullptr) {
      assert(log_stream != stdout);
      fclose(log_stream);
    }
  }